

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::SchemaParser::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  Builder result;
  Reader statements_00;
  Builder result_00;
  Array<const_char> content;
  Orphanage orphanage_local;
  Builder statements;
  Builder local_188;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  ListBuilder local_130;
  MallocMessageBuilder lexedBuilder;
  
  orphanage_local.capTable = orphanage.capTable;
  orphanage_local.arena = orphanage.arena;
  (*((this->file).ptr)->_vptr_SchemaFile[1])(&content);
  lexedBuilder.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)&content;
  kj::Lazy<kj::Vector<unsigned_int>>::
  get<capnp::SchemaParser::ModuleImpl::loadContent(capnp::Orphanage)::_lambda(kj::SpaceFor<kj::Vector<unsigned_int>>&)_1_>
            ((Lazy<kj::Vector<unsigned_int>> *)&this->lineBreaks,
             (anon_class_8_1_bc116759_for_func *)&lexedBuilder);
  MallocMessageBuilder::MallocMessageBuilder(&lexedBuilder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedStatements>
            (&statements,&lexedBuilder.super_MessageBuilder);
  result._builder.capTable = statements._builder.capTable;
  result._builder.segment = statements._builder.segment;
  result._builder.data = statements._builder.data;
  result._builder.pointers = statements._builder.pointers;
  result._builder.dataSize = statements._builder.dataSize;
  result._builder.pointerCount = statements._builder.pointerCount;
  result._builder._38_2_ = statements._builder._38_2_;
  capnp::compiler::lex((ArrayPtr<const_char>)content._0_16_,result,(ErrorReporter *)this);
  Orphanage::newOrphan<capnp::compiler::ParsedFile>(__return_storage_ptr__,&orphanage_local);
  capnp::compiler::LexedStatements::Builder::getStatements((Builder *)&local_130,&statements);
  capnp::_::ListBuilder::asReader(&local_130);
  capnp::_::OrphanGetImpl<capnp::compiler::ParsedFile,_(capnp::Kind)3>::apply
            (&local_188,&__return_storage_ptr__->builder);
  statements_00.reader.capTable = (CapTableReader *)uStack_158;
  statements_00.reader.segment = (SegmentReader *)local_160;
  statements_00.reader.ptr = (byte *)local_150;
  statements_00.reader.elementCount = (undefined4)uStack_148;
  statements_00.reader.step = uStack_148._4_4_;
  statements_00.reader.structDataSize = (undefined4)local_140;
  statements_00.reader.structPointerCount = local_140._4_2_;
  statements_00.reader.elementSize = local_140._6_1_;
  statements_00.reader._39_1_ = local_140._7_1_;
  statements_00.reader._40_8_ = uStack_138;
  result_00._builder.capTable = local_188._builder.capTable;
  result_00._builder.segment = local_188._builder.segment;
  result_00._builder.data = local_188._builder.data;
  result_00._builder.pointers = local_188._builder.pointers;
  result_00._builder.dataSize = local_188._builder.dataSize;
  result_00._builder.pointerCount = local_188._builder.pointerCount;
  result_00._builder._38_2_ = local_188._builder._38_2_;
  capnp::compiler::parseFile(statements_00,result_00,(ErrorReporter *)this);
  MallocMessageBuilder::~MallocMessageBuilder(&lexedBuilder);
  kj::Array<const_char>::~Array(&content);
  return __return_storage_ptr__;
}

Assistant:

Orphan<compiler::ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->readContent();

    lineBreaks.get([&](kj::SpaceFor<kj::Vector<uint>>& space) {
      auto vec = space.construct(content.size() / 40);
      vec->add(0);
      for (const char* pos = content.begin(); pos < content.end(); ++pos) {
        if (*pos == '\n') {
          vec->add(pos + 1 - content.begin());
        }
      }
      return vec;
    });

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<compiler::LexedStatements>();
    compiler::lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<compiler::ParsedFile>();
    compiler::parseFile(statements.getStatements(), parsed.get(), *this);
    return parsed;
  }